

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_key<toml::type_config>
            (result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  value_type *__args;
  error_type *this;
  error_info *v;
  sequence *ctx_00;
  EVP_PKEY_CTX *ctx_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  key;
  region reg;
  location first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368 [2];
  undefined8 uStack_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_340;
  undefined8 uStack_330;
  size_t local_328;
  string local_318;
  string local_2f8;
  undefined1 local_2d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2b8;
  undefined8 local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a0;
  pointer local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_288;
  pointer pbStack_278;
  pointer local_270;
  pointer pbStack_268;
  size_t local_260;
  location local_250;
  sequence local_208;
  pointer local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  pointer local_1d8;
  element_type *peStack_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1c0;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  _Alloc_hider local_1a8;
  pointer local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  pointer local_188;
  pointer pbStack_180;
  pointer local_178;
  success<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>_>
  local_168;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  location::location(&local_250,loc);
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar3 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    do {
      parse_simple_key<toml::type_config>
                ((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                  *)local_388,loc,ctx);
      if (local_388[0] == false) {
        this = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
               ::unwrap_err((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                             *)local_388,(source_location)0x55fee8);
        err<toml::error_info&>(&local_e0,(toml *)this,v);
        __return_storage_ptr__->is_ok_ = false;
        ctx_01 = (EVP_PKEY_CTX *)&local_e0;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_e0);
        failure<toml::error_info>::~failure(&local_e0);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::cleanup((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                   *)local_388,ctx_01);
        goto LAB_003b6f1e;
      }
      __args = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
               ::unwrap((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                         *)local_388,(source_location)0x55ff00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
      syntax::dot_sep(&local_208,&ctx->toml_spec_);
      ctx_00 = &local_208;
      sequence::scan((region *)local_2d8,&local_208,loc);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector(&local_208.others_);
      uVar4 = local_2d8._0_8_;
      region::~region((region *)local_2d8);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
      ::cleanup((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                 *)local_388,(EVP_PKEY_CTX *)ctx_00);
    } while (((pointer)uVar4 != (pointer)0x0) &&
            (peVar3 = (loc->source_).
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,
            loc->location_ <
            (ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start)));
  }
  if (local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    region::region((region *)local_388,&local_250);
    source_location::source_location((source_location *)local_2d8,(region *)local_388);
    region::~region((region *)local_388);
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f8,"toml::parse_key: expected a new key, but got nothing","");
    local_1a8._M_p = (pointer)&local_198;
    local_1b8 = (undefined4)local_2a8;
    uStack_1b4 = local_2a8._4_4_;
    uStack_1b0 = aStack_2a0._M_allocated_capacity._0_4_;
    uStack_1ac = aStack_2a0._M_allocated_capacity._4_4_;
    local_1c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_2b8._M_allocated_capacity;
    paStack_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)aStack_2b8._8_8_;
    local_1d8 = (pointer)local_2d8._16_8_;
    peStack_1d0 = (element_type *)local_2d8._24_8_;
    local_1e8 = (pointer)local_2d8._0_8_;
    p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)aStack_2a0._8_8_ == &aStack_288) {
      local_198._8_8_ = aStack_288._8_8_;
    }
    else {
      local_1a8._M_p = (pointer)aStack_2a0._8_8_;
    }
    local_1a0 = local_290;
    local_290 = (pointer)0x0;
    aStack_288._M_allocated_capacity = aStack_288._M_allocated_capacity & 0xffffffffffffff00;
    local_188 = pbStack_278;
    pbStack_180 = local_270;
    local_178 = pbStack_268;
    pbStack_278 = (pointer)0x0;
    local_270 = (pointer)0x0;
    pbStack_268 = (pointer)0x0;
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    aStack_2a0._8_8_ = &aStack_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"reached EOF","");
    make_error_info<>((error_info *)local_388,&local_2f8,(source_location *)&local_1e8,&local_318);
    err<toml::error_info>(&local_88,(error_info *)local_388);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368[1]._8_8_ != &aStack_340) {
      operator_delete((void *)local_368[1]._8_8_,aStack_340._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._0_8_ != &local_378) {
      operator_delete((void *)local_388._0_8_,local_378._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_2d8);
  }
  else {
    local_388._0_8_ =
         local_250.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_388._8_8_ =
         local_250.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_250.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_250.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_250.source_.
                     super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_250.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_250.source_.
                     super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 8) + 1;
      }
    }
    local_378._M_allocated_capacity = (size_type)local_368;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_378,local_250.source_name_._M_dataplus._M_p,
               local_250.source_name_._M_dataplus._M_p + local_250.source_name_._M_string_length);
    uVar4 = local_378._M_allocated_capacity;
    local_368[1]._8_8_ = local_250.location_;
    uStack_348 = local_250.line_number_;
    aStack_340._M_allocated_capacity = local_250.column_number_;
    aStack_340._8_8_ = loc->location_;
    uStack_330 = loc->line_number_;
    local_368[1]._0_8_ = aStack_340._8_8_ - local_250.location_;
    local_328 = loc->column_number_;
    aStack_2b8._8_8_ = &aStack_2a0;
    local_2d8._0_8_ =
         local_3a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2d8._8_8_ =
         local_3a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2d8._16_8_ =
         local_3a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d8._24_8_ = local_388._0_8_;
    aStack_2b8._M_allocated_capacity = local_388._8_8_;
    local_388._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_388._8_8_ = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_allocated_capacity == local_368) {
      aStack_2a0._8_8_ = local_368[0]._8_8_;
    }
    else {
      aStack_2b8._8_8_ = local_378._M_allocated_capacity;
    }
    local_2a8 = local_378._8_8_;
    local_378._8_8_ = 0;
    local_368[0]._M_local_buf[0] = '\0';
    aStack_288._M_allocated_capacity = local_250.location_;
    aStack_288._8_8_ = local_250.line_number_;
    pbStack_278 = (pointer)local_250.column_number_;
    local_378._M_allocated_capacity = (size_type)local_368;
    local_290 = (pointer)local_368[1]._0_8_;
    local_270 = (pointer)aStack_340._8_8_;
    pbStack_268 = (pointer)uStack_330;
    local_260 = local_328;
    ok<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>>
              (&local_168,(toml *)local_2d8,
               (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                *)uVar4);
    _Var5._M_pi = local_168.value.second.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_168.value.first.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->field_1).succ_.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_168.value.first.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->field_1).succ_.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_168.value.first.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_168.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_168.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.value.second.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->field_1).succ_.value.second.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_168.value.second.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (__return_storage_ptr__->field_1).succ_.value.second.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var5._M_pi;
    local_168.value.second.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    psVar1 = &(__return_storage_ptr__->field_1).fail_.value.suffix_;
    (__return_storage_ptr__->field_1).succ_.value.second.source_name_._M_dataplus._M_p =
         (pointer)psVar1;
    paVar2 = &local_168.value.second.source_name_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.value.second.source_name_._M_dataplus._M_p == paVar2) {
      (psVar1->_M_dataplus)._M_p =
           (pointer)CONCAT71(local_168.value.second.source_name_.field_2._M_allocated_capacity._1_7_
                             ,local_168.value.second.source_name_.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->field_1).succ_.value.second.source_name_.field_2 + 8) =
           local_168.value.second.source_name_.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ_.value.second.source_name_._M_dataplus._M_p =
           local_168.value.second.source_name_._M_dataplus._M_p;
      (__return_storage_ptr__->field_1).fail_.value.suffix_._M_dataplus._M_p =
           (pointer)CONCAT71(local_168.value.second.source_name_.field_2._M_allocated_capacity._1_7_
                             ,local_168.value.second.source_name_.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->field_1).succ_.value.second.source_name_._M_string_length =
         local_168.value.second.source_name_._M_string_length;
    local_168.value.second.source_name_._M_string_length = 0;
    local_168.value.second.source_name_.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->field_1).succ_.value.second.last_column_ =
         local_168.value.second.last_column_;
    (__return_storage_ptr__->field_1).succ_.value.second.last_ = local_168.value.second.last_;
    (__return_storage_ptr__->field_1).succ_.value.second.last_line_ =
         local_168.value.second.last_line_;
    (__return_storage_ptr__->field_1).succ_.value.second.first_line_ =
         local_168.value.second.first_line_;
    (__return_storage_ptr__->field_1).succ_.value.second.first_column_ =
         local_168.value.second.first_column_;
    (__return_storage_ptr__->field_1).succ_.value.second.length_ = local_168.value.second.length_;
    (__return_storage_ptr__->field_1).succ_.value.second.first_ = local_168.value.second.first_;
    local_168.value.second.source_name_._M_dataplus._M_p = (pointer)paVar2;
    region::~region(&local_168.value.second);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
    region::~region((region *)(local_2d8 + 0x18));
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2d8);
    region::~region((region *)local_388);
  }
LAB_003b6f1e:
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  location::~location(&local_250);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<std::vector<typename basic_value<TC>::key_type>, region>, error_info>
parse_key(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    using key_type = typename basic_value<TC>::key_type;
    std::vector<key_type> keys;
    while( ! loc.eof())
    {
        auto key = parse_simple_key(loc, ctx);
        if( ! key.is_ok())
        {
            return err(key.unwrap_err());
        }
        keys.push_back(std::move(key.unwrap()));

        auto reg = syntax::dot_sep(spec).scan(loc);
        if( ! reg.is_ok())
        {
            break;
        }
    }
    if(keys.empty())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_key: expected a new key, "
                    "but got nothing", std::move(src), "reached EOF"));
    }

    return ok(std::make_pair(std::move(keys), region(first, loc)));
}